

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-assertion-result.h
# Opt level: O1

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char **value)

{
  size_t sVar1;
  ostream *poVar2;
  char *__s;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  
  Message::Message((Message *)&local_30);
  __s = *value;
  poVar2 = (ostream *)(local_30._M_head_impl + 0x10);
  if (__s == (char *)0x0) {
    sVar1 = 6;
    __s = "(null)";
  }
  else {
    sVar1 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
  AppendMessage(this,(Message *)&local_30);
  if (local_30._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }